

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O1

CuTest * CuTestNew(char *name,TestFunction function)

{
  CuTest *pCVar1;
  char *pcVar2;
  
  pCVar1 = (CuTest *)malloc(0x28);
  pcVar2 = CuStrCopy(name);
  pCVar1->name = pcVar2;
  pCVar1->failed = 0;
  pCVar1->ran = 0;
  pCVar1->message = (char *)0x0;
  pCVar1->function = function;
  pCVar1->jumpBuf = (jmp_buf *)0x0;
  return pCVar1;
}

Assistant:

CuTest* CuTestNew(const char* name, TestFunction function)
{
	CuTest* tc = CU_ALLOC(CuTest);
	CuTestInit(tc, name, function);
	return tc;
}